

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O0

int link_set_max_message_size(LINK_HANDLE link,uint64_t max_message_size)

{
  LOGGER_LOG p_Var1;
  LOGGER_LOG l;
  int result;
  uint64_t max_message_size_local;
  LINK_HANDLE link_local;
  
  if (link == (LINK_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                ,"link_set_max_message_size",0x429,1,"NULL link");
    }
    l._4_4_ = 0x42a;
  }
  else {
    link->max_message_size = max_message_size;
    l._4_4_ = 0;
  }
  return l._4_4_;
}

Assistant:

int link_set_max_message_size(LINK_HANDLE link, uint64_t max_message_size)
{
    int result;

    if (link == NULL)
    {
        LogError("NULL link");
        result = MU_FAILURE;
    }
    else
    {
        link->max_message_size = max_message_size;
        result = 0;
    }

    return result;
}